

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::get_arg(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *this,int id)

{
  int in_ECX;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  local_38;
  type local_28;
  
  internal::
  get_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
            ((format_arg *)&local_38.string,(internal *)&this->context,
             (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
              *)(ulong)(uint)id,in_ECX);
  (this->arg).type_ = local_28;
  (this->arg).value_.field_0.long_long_value = local_38.long_long_value;
  (this->arg).value_.field_0.string.size = local_38.string.size;
  return;
}

Assistant:

void get_arg(int id) { arg = internal::get_arg(context, id); }